

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void regprint(regex_t *r,FILE *d)

{
  re_guts *g_00;
  char *pcVar1;
  uint local_438 [2];
  int nincat [256];
  int local_2c;
  int local_28;
  int last;
  int c;
  int i;
  re_guts *g;
  FILE *d_local;
  regex_t *r_local;
  
  g_00 = r->re_g;
  fprintf((FILE *)d,"%ld states, %d categories",g_00->nstates,(ulong)(uint)g_00->ncategories);
  fprintf((FILE *)d,", first %ld last %ld",g_00->firststate,g_00->laststate);
  if ((g_00->iflags & 1U) != 0) {
    fprintf((FILE *)d,", USEBOL");
  }
  if ((g_00->iflags & 2U) != 0) {
    fprintf((FILE *)d,", USEEOL");
  }
  if ((g_00->iflags & 4U) != 0) {
    fprintf((FILE *)d,", BAD");
  }
  if (g_00->nsub != 0) {
    fprintf((FILE *)d,", nsub=%ld",g_00->nsub);
  }
  if (g_00->must != (char *)0x0) {
    fprintf((FILE *)d,", must(%ld) `%*s\'",(long)g_00->mlen,(ulong)(uint)g_00->mlen,g_00->must);
  }
  if (g_00->backrefs != 0) {
    fprintf((FILE *)d,", backrefs");
  }
  if (0 < g_00->nplus) {
    fprintf((FILE *)d,", nplus %ld",g_00->nplus);
  }
  fprintf((FILE *)d,"\n");
  s_print(g_00,d);
  for (last = 0; last < g_00->ncategories; last = last + 1) {
    local_438[last] = 0;
    for (local_28 = -0x80; local_28 < 0x80; local_28 = local_28 + 1) {
      if ((uint)g_00->categories[local_28] == last) {
        local_438[last] = local_438[last] + 1;
      }
    }
  }
  fprintf((FILE *)d,"cc0#%d",(ulong)local_438[0]);
  for (last = 1; last < g_00->ncategories; last = last + 1) {
    if (local_438[last] == 1) {
      local_28 = -0x80;
      while ((local_28 < 0x80 && ((uint)g_00->categories[local_28] != last))) {
        local_28 = local_28 + 1;
      }
      pcVar1 = regchar(local_28);
      fprintf((FILE *)d,", %d=%s",(ulong)(uint)last,pcVar1);
    }
  }
  fprintf((FILE *)d,"\n");
  for (last = 1; last < g_00->ncategories; last = last + 1) {
    if (local_438[last] != 1) {
      fprintf((FILE *)d,"cc%d\t",(ulong)(uint)last);
      local_2c = -1;
      for (local_28 = -0x80; local_28 < 0x81; local_28 = local_28 + 1) {
        if ((local_28 < 0x80) && ((uint)g_00->categories[local_28] == last)) {
          if (local_2c < 0) {
            pcVar1 = regchar(local_28);
            fprintf((FILE *)d,"%s",pcVar1);
            local_2c = local_28;
          }
        }
        else if (-1 < local_2c) {
          if (local_2c != local_28 + -1) {
            pcVar1 = regchar(local_28 + -1);
            fprintf((FILE *)d,"-%s",pcVar1);
          }
          local_2c = -1;
        }
      }
      fprintf((FILE *)d,"\n");
    }
  }
  return;
}

Assistant:

void
regprint(r, d)
regex_t *r;
FILE *d;
{
	struct re_guts *g = r->re_g;
	int i;
	int c;
	int last;
	int nincat[NC];

	fprintf(d, "%ld states, %d categories", (long)g->nstates,
							g->ncategories);
	fprintf(d, ", first %ld last %ld", (long)g->firststate,
						(long)g->laststate);
	if (g->iflags&USEBOL)
		fprintf(d, ", USEBOL");
	if (g->iflags&USEEOL)
		fprintf(d, ", USEEOL");
	if (g->iflags&BAD)
		fprintf(d, ", BAD");
	if (g->nsub > 0)
		fprintf(d, ", nsub=%ld", (long)g->nsub);
	if (g->must != NULL)
		fprintf(d, ", must(%ld) `%*s'", (long)g->mlen, (int)g->mlen,
								g->must);
	if (g->backrefs)
		fprintf(d, ", backrefs");
	if (g->nplus > 0)
		fprintf(d, ", nplus %ld", (long)g->nplus);
	fprintf(d, "\n");
	s_print(g, d);
	for (i = 0; i < g->ncategories; i++) {
		nincat[i] = 0;
		for (c = CHAR_MIN; c <= CHAR_MAX; c++)
			if (g->categories[c] == i)
				nincat[i]++;
	}
	fprintf(d, "cc0#%d", nincat[0]);
	for (i = 1; i < g->ncategories; i++)
		if (nincat[i] == 1) {
			for (c = CHAR_MIN; c <= CHAR_MAX; c++)
				if (g->categories[c] == i)
					break;
			fprintf(d, ", %d=%s", i, regchar(c));
		}
	fprintf(d, "\n");
	for (i = 1; i < g->ncategories; i++)
		if (nincat[i] != 1) {
			fprintf(d, "cc%d\t", i);
			last = -1;
			for (c = CHAR_MIN; c <= CHAR_MAX+1; c++)	/* +1 does flush */
				if (c <= CHAR_MAX && g->categories[c] == i) {
					if (last < 0) {
						fprintf(d, "%s", regchar(c));
						last = c;
					}
				} else {
					if (last >= 0) {
						if (last != c-1)
							fprintf(d, "-%s",
								regchar(c-1));
						last = -1;
					}
				}
			fprintf(d, "\n");
		}
}